

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  bool bVar1;
  Column *col;
  ostream *poVar2;
  TablePrinter *extraout_RAX;
  lineOfChars local_d1;
  Column local_d0;
  reference local_98;
  ColumnInfo *info;
  iterator __end3;
  iterator __begin3;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *__range3;
  undefined1 local_68 [8];
  Column spacer;
  Columns headerCols;
  TablePrinter *this_local;
  
  if ((this->m_isOpen & 1U) == 0) {
    this->m_isOpen = true;
    Catch::operator<<(this,__file,___oflag);
    TextFlow::Columns::Columns((Columns *)&spacer.m_initialIndent);
    TextFlow::Spacer((Column *)local_68,2);
    __end3 = std::
             vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ::begin(&this->m_columnInfos);
    info = (ColumnInfo *)
           std::
           vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ::end(&this->m_columnInfos);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
                                  *)&info);
      if (!bVar1) break;
      local_98 = __gnu_cxx::
                 __normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
                 ::operator*(&__end3);
      if (local_98->width < 3) {
        __assert_fail("info.width > 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                      ,0x2172,"void Catch::TablePrinter::open()");
      }
      TextFlow::Column::Column(&local_d0,&local_98->name);
      col = TextFlow::Column::width(&local_d0,local_98->width - 2);
      TextFlow::Columns::operator+=((Columns *)&spacer.m_initialIndent,col);
      TextFlow::Column::~Column(&local_d0);
      TextFlow::Columns::operator+=((Columns *)&spacer.m_initialIndent,(Column *)local_68);
      __gnu_cxx::
      __normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
      ::operator++(&__end3);
    }
    poVar2 = TextFlow::operator<<(this->m_os,(Columns *)&spacer.m_initialIndent);
    std::operator<<(poVar2,'\n');
    poVar2 = this->m_os;
    lineOfChars::lineOfChars(&local_d1,'-');
    poVar2 = Catch::operator<<(poVar2,local_d1);
    std::operator<<(poVar2,'\n');
    TextFlow::Column::~Column((Column *)local_68);
    TextFlow::Columns::~Columns((Columns *)&spacer.m_initialIndent);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();

			TextFlow::Columns headerCols;
			auto spacer = TextFlow::Spacer(2);
			for (auto const& info : m_columnInfos) {
                assert(info.width > 2);
				headerCols += TextFlow::Column(info.name).width(info.width - 2);
				headerCols += spacer;
			}
			m_os << headerCols << '\n';

            m_os << lineOfChars('-') << '\n';
        }
    }